

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_decrypt_ticket_evp
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_EVP_MAC_CTX_ptr_int *cb)

{
  int iVar1;
  undefined1 local_98 [8];
  uint8_t hmac [64];
  size_t hmac_size;
  int ret;
  int clen;
  size_t hlen;
  EVP_MAC_CTX *hctx;
  EVP_MAC *mac;
  EVP_CIPHER_CTX *cctx;
  _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_EVP_MAC_CTX_ptr_int *cb_local;
  ptls_buffer_t *buf_local;
  ptls_iovec_t src_local;
  
  src_local.base = (uint8_t *)src.len;
  buf_local = (ptls_buffer_t *)src.base;
  mac = (EVP_MAC *)0x0;
  hctx = (EVP_MAC_CTX *)0x0;
  hlen = 0;
  cctx = (EVP_CIPHER_CTX *)cb;
  cb_local = (_func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_EVP_MAC_CTX_ptr_int *)buf;
  mac = (EVP_MAC *)EVP_CIPHER_CTX_new();
  if ((EVP_CIPHER_CTX *)mac == (EVP_CIPHER_CTX *)0x0) {
    hmac_size._0_4_ = 0x201;
  }
  else {
    hctx = (EVP_MAC_CTX *)EVP_MAC_fetch(0,"HMAC");
    if (hctx == (EVP_MAC_CTX *)0x0) {
      hmac_size._0_4_ = 0x201;
    }
    else {
      hlen = EVP_MAC_CTX_new(hctx);
      if (hlen == 0) {
        hmac_size._0_4_ = 0x201;
      }
      else if (src_local.base < (uint8_t *)0x20) {
        hmac_size._0_4_ = 0x32;
      }
      else {
        iVar1 = (*(code *)cctx)(buf_local,&buf_local->off,mac,hlen,0);
        if (iVar1 == 0) {
          hmac_size._0_4_ = 0x203;
        }
        else {
          hmac._56_8_ = EVP_MAC_CTX_get_mac_size(hlen);
          if (src_local.base < (uint8_t *)(hmac._56_8_ + 0x20)) {
            hmac_size._0_4_ = 0x32;
          }
          else {
            src_local.base = src_local.base + -hmac._56_8_;
            iVar1 = EVP_MAC_update(hlen,buf_local,src_local.base);
            if ((iVar1 == 0) || (iVar1 = EVP_MAC_final(hlen,local_98,&ret,0x40), iVar1 == 0)) {
              hmac_size._0_4_ = 0x203;
            }
            else {
              iVar1 = (*ptls_mem_equal)(src_local.base + (long)&buf_local->base,local_98,hmac._56_8_
                                       );
              if (iVar1 == 0) {
                hmac_size._0_4_ = 0x28;
              }
              else {
                buf_local = buf_local + 1;
                src_local.base = src_local.base + -0x20;
                hmac_size._0_4_ =
                     ptls_buffer_reserve((ptls_buffer_t *)cb_local,(size_t)src_local.base);
                if ((int)hmac_size == 0) {
                  iVar1 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)mac,
                                            (uchar *)(*(long *)cb_local + *(long *)(cb_local + 0x10)
                                                     ),(int *)((long)&hmac_size + 4),
                                            (uchar *)buf_local,(int)src_local.base);
                  if (iVar1 == 0) {
                    hmac_size._0_4_ = 0x203;
                  }
                  else {
                    *(long *)(cb_local + 0x10) = (long)hmac_size._4_4_ + *(long *)(cb_local + 0x10);
                    iVar1 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)mac,
                                                (uchar *)(*(long *)cb_local +
                                                         *(long *)(cb_local + 0x10)),
                                                (int *)((long)&hmac_size + 4));
                    if (iVar1 == 0) {
                      hmac_size._0_4_ = 0x203;
                    }
                    else {
                      *(long *)(cb_local + 0x10) =
                           (long)hmac_size._4_4_ + *(long *)(cb_local + 0x10);
                      hmac_size._0_4_ = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (mac != (EVP_MAC *)0x0) {
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)mac);
  }
  if (hlen != 0) {
    EVP_MAC_CTX_free(hlen);
  }
  if (hctx != (EVP_MAC_CTX *)0x0) {
    EVP_MAC_free(hctx);
  }
  return (int)hmac_size;
}

Assistant:

int ptls_openssl_decrypt_ticket_evp(ptls_buffer_t *buf, ptls_iovec_t src,
                                    int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, EVP_MAC_CTX *hctx,
                                              int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    EVP_MAC *mac = NULL;
    EVP_MAC_CTX *hctx = NULL;
    size_t hlen;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((mac = EVP_MAC_fetch(NULL, "HMAC", NULL)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = EVP_MAC_CTX_new(mac)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* obtain cipher and hash context.
     * Note: no need to handle renew, since in picotls we always send a new ticket to minimize the chance of ticket reuse */
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if (!(*cb)(src.base, src.base + TICKET_LABEL_SIZE, cctx, hctx, 0)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    /* check hmac, and exclude label, iv, hmac */
    size_t hmac_size = EVP_MAC_CTX_get_mac_size(hctx);
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE + hmac_size) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    src.len -= hmac_size;
    uint8_t hmac[EVP_MAX_MD_SIZE];
    if (!EVP_MAC_update(hctx, src.base, src.len) || !EVP_MAC_final(hctx, hmac, &hlen, sizeof(hmac))) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (!ptls_mem_equal(src.base + src.len, hmac, hmac_size)) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }
    src.base += TICKET_LABEL_SIZE + TICKET_IV_SIZE;
    src.len -= TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* decrypt */
    if ((ret = ptls_buffer_reserve(buf, src.len)) != 0)
        goto Exit;
    if (!EVP_DecryptUpdate(cctx, buf->base + buf->off, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;
    if (!EVP_DecryptFinal_ex(cctx, buf->base + buf->off, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;

    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        EVP_MAC_CTX_free(hctx);
    if (mac != NULL)
        EVP_MAC_free(mac);
    return ret;
}